

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void xmlInitThreads(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (libxml_is_threaded == -1) {
    auVar1._12_4_ = 0;
    auVar1._0_12_ = ZEXT812(0xffffffff) & ZEXT812(0xffffffff00000000);
    auVar4._12_4_ = 0;
    auVar4._0_12_ = ZEXT812(0xffffffff) & ZEXT812(0xffffffff) << 0x20;
    auVar4 = packssdw(auVar4,auVar1);
    auVar2._12_4_ = 0;
    auVar2._0_12_ = ZEXT812(0xffffffff) & ZEXT812(0xffffffff) << 0x20;
    auVar3._12_4_ = 0;
    auVar3._0_12_ = ZEXT812(0xffffffff) & ZEXT812(0xffffffff) << 0x20;
    auVar1 = packssdw(auVar3,auVar2);
    auVar1 = packssdw(auVar1,auVar4);
    libxml_is_threaded =
         (uint)((((((((auVar1 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar1 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar1 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar1 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar1 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar1 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar1 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar1[0xf]);
    return;
  }
  return;
}

Assistant:

void
xmlInitThreads(void)
{
#ifdef HAVE_POSIX_THREADS
#ifdef XML_PTHREAD_WEAK
    if (libxml_is_threaded == -1) {
        if ((pthread_once != NULL) &&
            (pthread_getspecific != NULL) &&
            (pthread_setspecific != NULL) &&
            (pthread_key_create != NULL) &&
            (pthread_key_delete != NULL) &&
            (pthread_mutex_init != NULL) &&
            (pthread_mutex_destroy != NULL) &&
            (pthread_mutex_lock != NULL) &&
            (pthread_mutex_unlock != NULL) &&
            (pthread_cond_init != NULL) &&
            (pthread_cond_destroy != NULL) &&
            (pthread_cond_wait != NULL) &&
            /*
             * pthread_equal can be inline, resuting in -Waddress warnings.
             * Let's assume it's available if all the other functions are.
             */
            /* (pthread_equal != NULL) && */
            (pthread_self != NULL) &&
            (pthread_cond_signal != NULL)) {
            libxml_is_threaded = 1;

/* fprintf(stderr, "Running multithreaded\n"); */
        } else {

/* fprintf(stderr, "Running without multithread\n"); */
            libxml_is_threaded = 0;
        }
    }
#endif /* XML_PTHREAD_WEAK */
#endif
}